

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoi.h
# Opt level: O2

void * qoi_read(char *filename,qoi_desc *desc,int channels)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  void *__ptr;
  size_t sVar3;
  void *pvVar4;
  uint size;
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    size = (uint)lVar2;
    if ((0 < (int)size) && (iVar1 = fseek(__stream,0,0), iVar1 == 0)) {
      __ptr = malloc((ulong)(size & 0x7fffffff));
      if (__ptr != (void *)0x0) {
        sVar3 = fread(__ptr,1,(ulong)(size & 0x7fffffff),__stream);
        fclose(__stream);
        if ((uint)sVar3 == size) {
          pvVar4 = qoi_decode(__ptr,size,desc,channels);
        }
        else {
          pvVar4 = (void *)0x0;
        }
        free(__ptr);
        return pvVar4;
      }
    }
    fclose(__stream);
  }
  return (void *)0x0;
}

Assistant:

void *qoi_read(const char *filename, qoi_desc *desc, int channels) {
	FILE *f = fopen(filename, "rb");
	int size, bytes_read;
	void *pixels, *data;

	if (!f) {
		return NULL;
	}

	fseek(f, 0, SEEK_END);
	size = ftell(f);
	if (size <= 0 || fseek(f, 0, SEEK_SET) != 0) {
		fclose(f);
		return NULL;
	}

	data = QOI_MALLOC(size);
	if (!data) {
		fclose(f);
		return NULL;
	}

	bytes_read = fread(data, 1, size, f);
	fclose(f);
	pixels = (bytes_read != size) ? NULL : qoi_decode(data, bytes_read, desc, channels);
	QOI_FREE(data);
	return pixels;
}